

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContinuousPageStack.h
# Opt level: O3

void __thiscall
ContinuousPageStack<1UL>::Resize(ContinuousPageStack<1UL> *this,size_t requestedSize)

{
  size_t sVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  PageAllocation *pPVar5;
  char *message;
  char *error;
  uint lineNumber;
  
  if (requestedSize == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    error = "(requestedSize)";
    message = "requestedSize";
    lineNumber = 0x10e;
LAB_00efbc52:
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,lineNumber,error,message);
    if (!bVar3) goto LAB_00efbdfe;
    *puVar4 = 0;
  }
  else if (0x1000 < requestedSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    error = "(requestedSize <= InitialPageCount * AutoSystemInfo::PageSize)";
    message = "requestedSize <= InitialPageCount * AutoSystemInfo::PageSize";
    lineNumber = 0x10f;
    goto LAB_00efbc52;
  }
  if (this->bufferSize == 0) {
    pPVar5 = Memory::
             PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
             ::AllocAllocation(this->pageAllocator,1);
    this->pageAllocation = pPVar5;
    if (pPVar5 == (PageAllocation *)0x0) {
      (*(this->super_Allocator).outOfMemoryFunc)();
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,0x117,"(false)","false");
      if (!bVar3) goto LAB_00efbdfe;
      *puVar4 = 0;
      pPVar5 = this->pageAllocation;
    }
  }
  else {
    pPVar5 = Memory::
             PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
             ::AllocAllocation(this->pageAllocator,this->pageAllocation->pageCount * 2);
    if (pPVar5 == (PageAllocation *)0x0) {
      (*(this->super_Allocator).outOfMemoryFunc)();
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,0x121,"(false)","false");
      if (!bVar3) goto LAB_00efbdfe;
      *puVar4 = 0;
    }
    sVar1 = pPVar5->pageCount;
    if (this->bufferSize == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,199,"(bufferSize)","bufferSize");
      if (!bVar3) {
LAB_00efbdfe:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    js_memcpy_s(pPVar5 + 1,sVar1 * 0x1000 - 0x10,this->pageAllocation + 1,this->nextTop);
    Memory::
    PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
    ::ReleaseAllocation(this->pageAllocator,this->pageAllocation);
    this->pageAllocation = pPVar5;
  }
  this->bufferSize = pPVar5->pageCount * 0x1000 - 0x10;
  return;
}

Assistant:

void ContinuousPageStack<InitialPageCount>::Resize(size_t requestedSize)
{
    Assert(requestedSize);
    Assert(requestedSize <= InitialPageCount * AutoSystemInfo::PageSize);

    if(!bufferSize)
    {
        pageAllocation = pageAllocator->AllocAllocation(InitialPageCount);
        if (!pageAllocation)
        {
            outOfMemoryFunc();
            AnalysisAssert(false);
        }
        bufferSize = pageAllocation->GetSize();
        return;
    }

    PageAllocation *const newPageAllocation = pageAllocator->AllocAllocation(pageAllocation->GetPageCount() * 2);
    if (!newPageAllocation)
    {
        outOfMemoryFunc();
        AnalysisAssert(false);
    }
    js_memcpy_s(newPageAllocation->GetAddress(), newPageAllocation->GetSize(), Buffer(), nextTop);
    pageAllocator->ReleaseAllocation(pageAllocation);
    pageAllocation = newPageAllocation;
    bufferSize = newPageAllocation->GetSize();
}